

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

HighsDebugStatus __thiscall
HEkkPrimal::debugPrimalSteepestEdgeWeights(HEkkPrimal *this,HighsInt alt_debug_level)

{
  vector<double,_std::allocator<double>_> *__x;
  HighsInt HVar1;
  HighsDebugStatus HVar2;
  ulong uVar3;
  ulong uVar4;
  HighsInt iCheck;
  uint uVar5;
  HighsInt iVar;
  double dVar6;
  double dVar7;
  double local_150;
  uint local_144;
  double local_140;
  vector<signed_char,_std::allocator<signed_char>_> nonbasic_flag;
  vector<double,_std::allocator<double>_> updated_primal_edge_weight;
  HVector local_col_aq;
  
  if (alt_debug_level < 0) {
    alt_debug_level = (this->ekk_instance_->options_->super_HighsOptionsStruct).highs_debug_level;
  }
  if (alt_debug_level < 2) {
    return kNotChecked;
  }
  HVar1 = (this->ekk_instance_->lp_).num_row_;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (&nonbasic_flag,&(this->ekk_instance_->basis_).nonbasicFlag_);
  local_col_aq.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_col_aq.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_col_aq.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_col_aq.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_col_aq.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_col_aq.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_col_aq.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_col_aq.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_col_aq.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_col_aq.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_col_aq.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_col_aq.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_col_aq.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_col_aq.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_col_aq.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_col_aq.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_col_aq.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_col_aq.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HVectorBase<double>::setup(&local_col_aq,HVar1);
  __x = &this->edge_weight_;
  if (alt_debug_level == 2) {
    uVar5 = this->num_tot;
    uVar3 = 0;
    uVar4 = 0;
    if (0 < (int)uVar5) {
      uVar4 = (ulong)uVar5;
    }
    local_150 = 0.0;
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      local_150 = local_150 +
                  ABS((double)(int)nonbasic_flag.
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar3] *
                      (this->edge_weight_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar3]);
    }
    local_144 = 1;
    if (1 < (int)uVar5 / 10) {
      local_144 = (int)uVar5 / 10;
    }
    if (99 < (int)uVar5) {
      local_144 = 10;
    }
    local_140 = 0.0;
    for (uVar5 = 0; uVar5 != local_144; uVar5 = uVar5 + 1) {
      do {
        HVar1 = HighsRandom::integer(&this->random_,this->num_tot);
      } while (nonbasic_flag.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start[HVar1] == '\0');
      dVar6 = computePrimalSteepestEdgeWeight(this,HVar1,&local_col_aq);
      local_140 = local_140 +
                  ABS((__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[HVar1] - dVar6);
    }
  }
  else {
    local_144 = this->num_col;
    std::vector<double,_std::allocator<double>_>::vector(&updated_primal_edge_weight,__x);
    computePrimalSteepestEdgeWeights(this);
    local_140 = 0.0;
    local_150 = 0.0;
    for (uVar3 = 0; (long)uVar3 < (long)this->num_tot; uVar3 = uVar3 + 1) {
      if (nonbasic_flag.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] != '\0') {
        dVar6 = (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar3];
        dVar7 = ABS(updated_primal_edge_weight.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar3] - dVar6);
        if (0.0001 < dVar7) {
          printf("debugPrimalSteepestEdgeWeights: var = %2d; weight (true = %10.4g; updated = %10.4g) error = %10.4g\n"
                 ,dVar6,updated_primal_edge_weight.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3],dVar7,uVar3 & 0xffffffff);
        }
        local_150 = local_150 + ABS(dVar6);
        local_140 = local_140 + dVar7;
      }
    }
    std::vector<double,_std::allocator<double>_>::operator=(__x,&updated_primal_edge_weight);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&updated_primal_edge_weight.super__Vector_base<double,_std::allocator<double>_>);
  }
  local_140 = local_140 / local_150;
  if (this->debug_max_relative_primal_steepest_edge_weight_error * 10.0 < local_140) {
    printf("HEkk::debugPrimalSteepestEdgeWeights Iteration %5d: Checked %2d weights: error = %10.4g; norm = %10.4g; relative error = %10.4g\n"
           ,(ulong)(uint)this->ekk_instance_->iteration_count_,(ulong)local_144);
    this->debug_max_relative_primal_steepest_edge_weight_error = local_140;
    if (0.001 < local_140) {
      HVar2 = kLargeError;
      goto LAB_00348819;
    }
  }
  HVar2 = kOk;
LAB_00348819:
  HVectorBase<double>::~HVectorBase(&local_col_aq);
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
            (&nonbasic_flag.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  return HVar2;
}

Assistant:

HighsDebugStatus HEkkPrimal::debugPrimalSteepestEdgeWeights(
    const HighsInt alt_debug_level) {
  const HighsInt use_debug_level =
      alt_debug_level >= 0 ? alt_debug_level
                           : ekk_instance_.options_->highs_debug_level;
  if (use_debug_level < kHighsDebugLevelCostly)
    return HighsDebugStatus::kNotChecked;
  const HighsLp& lp = ekk_instance_.lp_;
  const HighsInt num_row = lp.num_row_;
  const std::vector<int8_t> nonbasic_flag = ekk_instance_.basis_.nonbasicFlag_;
  double primal_steepest_edge_weight_norm = 0;
  double primal_steepest_edge_weight_error = 0;
  HighsInt num_check_weight;
  HVector local_col_aq;
  local_col_aq.setup(num_row);
  if (use_debug_level < kHighsDebugLevelExpensive) {
    for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
      primal_steepest_edge_weight_norm +=
          std::fabs(nonbasic_flag[iVar] * edge_weight_[iVar]);
    }
    // Just check a few weights
    num_check_weight =
        std::max((HighsInt)1, std::min((HighsInt)10, num_tot / 10));
    for (HighsInt iCheck = 0; iCheck < num_check_weight; iCheck++) {
      HighsInt iVar;
      for (;;) {
        iVar = random_.integer(num_tot);
        if (nonbasic_flag[iVar]) break;
      }
      const double true_weight =
          computePrimalSteepestEdgeWeight(iVar, local_col_aq);
      primal_steepest_edge_weight_error +=
          std::fabs(edge_weight_[iVar] - true_weight);
    }
  } else {
    // Check all weights
    num_check_weight = num_col;
    std::vector<double> updated_primal_edge_weight = edge_weight_;
    computePrimalSteepestEdgeWeights();
    for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
      if (!nonbasic_flag[iVar]) continue;
      primal_steepest_edge_weight_norm += std::fabs(edge_weight_[iVar]);
      const double error =
          std::fabs(updated_primal_edge_weight[iVar] - edge_weight_[iVar]);
      if (error > 1e-4)
        printf(
            "debugPrimalSteepestEdgeWeights: var = %2d; weight (true = %10.4g; "
            "updated = %10.4g) error = %10.4g\n",
            (int)iVar, edge_weight_[iVar], updated_primal_edge_weight[iVar],
            error);
      primal_steepest_edge_weight_error += error;
    }
    edge_weight_ = updated_primal_edge_weight;
  }
  // Now assess the relative error
  assert(primal_steepest_edge_weight_norm > 0);
  double relative_primal_steepest_edge_weight_error =
      primal_steepest_edge_weight_error / primal_steepest_edge_weight_norm;
  const double large_relative_primal_steepest_edge_weight_error = 1e-3;
  if (relative_primal_steepest_edge_weight_error >
      10 * debug_max_relative_primal_steepest_edge_weight_error) {
    printf(
        "HEkk::debugPrimalSteepestEdgeWeights Iteration %5d: Checked %2d "
        "weights: "
        "error = %10.4g; norm = %10.4g; relative error = %10.4g\n",
        (int)ekk_instance_.iteration_count_, (int)num_check_weight,
        primal_steepest_edge_weight_error, primal_steepest_edge_weight_norm,
        relative_primal_steepest_edge_weight_error);
    debug_max_relative_primal_steepest_edge_weight_error =
        relative_primal_steepest_edge_weight_error;
    if (relative_primal_steepest_edge_weight_error >
        large_relative_primal_steepest_edge_weight_error)
      return HighsDebugStatus::kLargeError;
  }
  return HighsDebugStatus::kOk;
}